

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void canvas_setargs(int argc,t_atom *argv)

{
  t_atom *ptVar1;
  
  if ((pd_maininstance.pd_gui)->i_newargv != (t_atom *)0x0) {
    freebytes((pd_maininstance.pd_gui)->i_newargv,(long)(pd_maininstance.pd_gui)->i_newargc << 4);
  }
  (pd_maininstance.pd_gui)->i_newargc = argc;
  ptVar1 = (t_atom *)copybytes(argv,(long)argc << 4);
  (pd_maininstance.pd_gui)->i_newargv = ptVar1;
  return;
}

Assistant:

void canvas_setargs(int argc, const t_atom *argv)
{
        /* if there's an old one lying around free it here.  This
        happens if an abstraction is loaded but never gets as far
        as calling canvas_new(). */
    if (THISGUI->i_newargv)
        freebytes(THISGUI->i_newargv, THISGUI->i_newargc * sizeof(t_atom));
    THISGUI->i_newargc = argc;
    THISGUI->i_newargv = copybytes(argv, argc * sizeof(t_atom));
}